

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap_reader.cpp
# Opt level: O2

void __thiscall pcap_reader::pcap_reader(pcap_reader *this)

{
  this->is_wrong_endian = false;
  this->fragment_length = 0;
  (this->header).magic_number = 0;
  (this->header).version_major = 0;
  (this->header).version_minor = 0;
  (this->header).thiszone = 0;
  (this->header).sigfigs = 0;
  (this->header).snaplen = 0;
  (this->header).network = 0;
  (this->frame_header).ts_sec = 0;
  (this->frame_header).ts_usec = 0;
  (this->frame_header).incl_len = 0;
  (this->frame_header).orig_len = 0;
  *(undefined8 *)&this->buffer_size = 0;
  *(undefined8 *)((long)&this->buffer + 4) = 0;
  this->ip_version = 0;
  this->tp_length = 0;
  this->tp_offset = 0;
  this->tp_version = 0;
  this->tp_port1 = 0;
  this->tp_port2 = 0;
  this->is_fragment = false;
  this->F_pcap = (FILE *)0x0;
  this->F_extract = (FILE *)0x0;
  return;
}

Assistant:

pcap_reader::pcap_reader()
    :
    is_wrong_endian(false),
    buffer_size(0),
    buffer (NULL),
    ip_offset(0),
    ip_version (0),
    tp_length(0),
    tp_offset(0),
    tp_version(0),
    tp_port1(0),
    tp_port2(0),
    is_fragment(false),
    fragment_length(0),
    F_pcap(NULL),
    F_extract(NULL)
{
    memset(&header, 0, sizeof(header));
    memset(&frame_header, 0, sizeof(frame_header));
}